

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void anon_unknown.dwarf_14c80dc::SpeakerDelegate::SDL_audio_callback
               (void *userdata,Uint8 *stream,int len)

{
  void *__src;
  void *__dest;
  int iVar1;
  size_t __n;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)((long)userdata + 0x10));
  if (iVar1 == 0) {
    uVar3 = (ulong)(long)len >> 1;
    uVar2 = *(long *)((long)userdata + 0x40) - (long)*(void **)((long)userdata + 0x38) >> 1;
    uVar4 = uVar3;
    if (uVar2 < uVar3) {
      uVar4 = uVar2;
    }
    memcpy(stream,*(void **)((long)userdata + 0x38),uVar4 * 2);
    if (uVar2 < uVar3) {
      memset(stream + uVar4 * 2,0,(uVar3 - uVar4) * 2);
    }
    if (uVar4 != 0) {
      __dest = *(void **)((long)userdata + 0x38);
      __src = (void *)((long)__dest + uVar4 * 2);
      __n = *(long *)((long)userdata + 0x40) - (long)__src;
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
      lVar5 = (long)__dest + (*(long *)((long)userdata + 0x40) - (long)__src);
      if (*(long *)((long)userdata + 0x40) != lVar5) {
        *(long *)((long)userdata + 0x40) = lVar5;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)((long)userdata + 0x10));
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static void SDL_audio_callback(void *userdata, Uint8 *stream, int len) {
		reinterpret_cast<SpeakerDelegate *>(userdata)->audio_callback(stream, len);
	}